

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void wasm::writeBase64VLQ(ostream *out,int32_t n)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = n * -2 + 1;
  if (-1 < n) {
    uVar3 = n * 2;
  }
  for (; uVar2 = uVar3 & 0x1f, 0x1f < uVar3; uVar3 = uVar3 >> 5) {
    if (uVar2 < 0x14) {
      cVar1 = (char)uVar2 + 'g';
    }
    else if (uVar2 < 0x1e) {
      cVar1 = (char)uVar2 + '\x1c';
    }
    else {
      cVar1 = (uVar2 != 0x1e) * '\x04' + '+';
    }
    std::operator<<(out,cVar1);
  }
  cVar1 = (char)uVar3 + 'A';
  if (0x19 < uVar2) {
    cVar1 = (char)uVar3 + 'G';
  }
  std::operator<<(out,cVar1);
  return;
}

Assistant:

static void writeBase64VLQ(std::ostream& out, int32_t n) {
  uint32_t value = n >= 0 ? n << 1 : ((-n) << 1) | 1;
  while (1) {
    uint32_t digit = value & 0x1F;
    value >>= 5;
    if (!value) {
      // last VLQ digit -- base64 codes 'A'..'Z', 'a'..'f'
      out << char(digit < 26 ? 'A' + digit : 'a' + digit - 26);
      break;
    }
    // more VLG digit will follow -- add continuation bit (0x20),
    // base64 codes 'g'..'z', '0'..'9', '+', '/'
    out << char(digit < 20
                  ? 'g' + digit
                  : digit < 30 ? '0' + digit - 20 : digit == 30 ? '+' : '/');
  }
}